

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::EnableDepthWrites(GLContextState *this,bool bEnable)

{
  ENABLE_STATE EVar1;
  undefined7 in_register_00000031;
  GLenum err;
  string msg;
  
  EVar1 = DISABLED - (int)CONCAT71(in_register_00000031,bEnable);
  if ((this->m_DSState).m_DepthWritesEnableState.m_EnableState != EVar1) {
    glDepthMask();
    err = glGetError();
    if (err != 0) {
      LogError<false,char[38],char[17],unsigned_int>
                (false,"EnableDepthWrites",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1eb,(char (*) [38])"Failed to enable/disable depth writes",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"EnableDepthWrites",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1eb);
      std::__cxx11::string::~string((string *)&msg);
    }
    (this->m_DSState).m_DepthWritesEnableState.m_EnableState = EVar1;
  }
  return;
}

Assistant:

void GLContextState::EnableDepthWrites(bool bEnable)
{
    if (m_DSState.m_DepthWritesEnableState != bEnable)
    {
        // If mask is non-zero, the depth buffer is enabled for writing; otherwise, it is disabled.
        glDepthMask(bEnable ? 1 : 0);
        DEV_CHECK_GL_ERROR("Failed to enable/disable depth writes");
        m_DSState.m_DepthWritesEnableState = bEnable;
    }
}